

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double value;
  Builder value_00;
  ListBuilder builder;
  ListBuilder builder_00;
  StructBuilder builder_01;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar1;
  bool value_04;
  char value_05;
  uchar value_06;
  ElementSize elementSize;
  Which WVar2;
  short value_07;
  unsigned_short uVar3;
  uint uVar4;
  int value_08;
  uint uVar5;
  long value_09;
  unsigned_long value_10;
  float value_11;
  Builder value_12;
  DynamicEnum value_13;
  PointerBuilder local_288;
  PointerBuilder local_270;
  Client local_258;
  Fault local_240;
  Fault f_1;
  DynamicEnum local_230;
  StructBuilder local_220;
  Schema local_1f8;
  Builder local_1f0;
  PointerBuilder local_1c0;
  ListBuilder local_1a8;
  Type local_180;
  Builder local_170;
  Schema local_138;
  StructSize local_12c;
  PointerBuilder local_128;
  ListBuilder local_110;
  Type local_e8;
  Builder local_d8;
  undefined1 local_a0 [8];
  ListSchema elementType;
  PointerBuilder local_68;
  Builder local_50;
  Fault local_28;
  Fault f;
  uint index_local;
  Builder *this_local;
  
  f.exception._4_4_ = index;
  uVar4 = size(this);
  if (uVar4 <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x448,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  WVar2 = ListSchema::whichElementType(&this->schema);
  switch(WVar2) {
  case VOID:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    _::ListBuilder::getDataElement<capnp::Void>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__);
    break;
  case BOOL:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_04 = _::ListBuilder::getDataElement<bool>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_04);
    break;
  case INT8:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_05 = _::ListBuilder::getDataElement<signed_char>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_05);
    break;
  case INT16:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_07 = _::ListBuilder::getDataElement<short>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_07);
    break;
  case INT32:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_08 = _::ListBuilder::getDataElement<int>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_08);
    break;
  case INT64:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_09 = _::ListBuilder::getDataElement<long>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_09);
    break;
  case UINT8:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_06 = _::ListBuilder::getDataElement<unsigned_char>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_06);
    break;
  case UINT16:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    uVar3 = _::ListBuilder::getDataElement<unsigned_short>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,uVar3);
    break;
  case UINT32:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    uVar5 = _::ListBuilder::getDataElement<unsigned_int>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,uVar5);
    break;
  case UINT64:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_10 = _::ListBuilder::getDataElement<unsigned_long>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_10);
    break;
  case FLOAT32:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value_11 = _::ListBuilder::getDataElement<float>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_11);
    break;
  case FLOAT64:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    value = _::ListBuilder::getDataElement<double>(&this->builder,uVar5);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value);
    break;
  case TEXT:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    _::ListBuilder::getPointerElement(&local_68,&this->builder,uVar5);
    _::PointerBuilder::getBlob<capnp::Text>(&local_50,&local_68,(void *)0x0,0);
    value_00.content.ptr = local_50.content.ptr;
    value_00._0_8_ = local_50._0_8_;
    value_00.content.size_ = local_50.content.size_;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_00);
    break;
  case DATA:
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    _::ListBuilder::getPointerElement
              ((PointerBuilder *)&elementType.elementType.field_4,&this->builder,uVar5);
    value_12 = _::PointerBuilder::getBlob<capnp::Data>
                         ((PointerBuilder *)&elementType.elementType.field_4,(void *)0x0,0);
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_12);
    break;
  case LIST:
    _local_a0 = (Type)ListSchema::getListElementType(&this->schema);
    WVar2 = ListSchema::whichElementType((ListSchema *)local_a0);
    TVar1 = _local_a0;
    _local_a0 = TVar1;
    if (WVar2 == STRUCT) {
      local_e8.baseType = local_a0._0_2_;
      local_e8.listDepth = local_a0[2];
      local_e8.isImplicitParam = (bool)local_a0[3];
      local_e8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a0._4_2_;
      local_e8._6_2_ = local_a0._6_2_;
      local_e8.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
      uVar5 = bounded<unsigned_int>(f.exception._4_4_);
      _::ListBuilder::getPointerElement(&local_128,&this->builder,uVar5);
      local_138.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_a0);
      local_12c = anon_unknown_70::structSizeFromSchema((StructSchema)local_138.raw);
      _::PointerBuilder::getStructList(&local_110,&local_128,local_12c,(word *)0x0);
      schema_00.elementType.field_4.schema = local_e8.field_4.schema;
      schema_00.elementType.baseType = local_e8.baseType;
      schema_00.elementType.listDepth = local_e8.listDepth;
      schema_00.elementType.isImplicitParam = local_e8.isImplicitParam;
      schema_00.elementType.field_3 = local_e8.field_3;
      schema_00.elementType._6_2_ = local_e8._6_2_;
      builder.capTable = local_110.capTable;
      builder.segment = local_110.segment;
      builder.ptr = local_110.ptr;
      builder.elementCount = local_110.elementCount;
      builder.step = local_110.step;
      builder.structDataSize = local_110.structDataSize;
      builder.structPointerCount = local_110.structPointerCount;
      builder.elementSize = local_110.elementSize;
      builder._39_1_ = local_110._39_1_;
      Builder(&local_d8,schema_00,builder);
      value_02.schema.elementType.field_4.schema = local_d8.schema.elementType.field_4.schema;
      value_02.schema.elementType.baseType = local_d8.schema.elementType.baseType;
      value_02.schema.elementType.listDepth = local_d8.schema.elementType.listDepth;
      value_02.schema.elementType.isImplicitParam = local_d8.schema.elementType.isImplicitParam;
      value_02.schema.elementType.field_3 = local_d8.schema.elementType.field_3;
      value_02.schema.elementType._6_2_ = local_d8.schema.elementType._6_2_;
      value_02.builder.segment = local_d8.builder.segment;
      value_02.builder.capTable = local_d8.builder.capTable;
      value_02.builder.ptr = local_d8.builder.ptr;
      value_02.builder.elementCount = local_d8.builder.elementCount;
      value_02.builder.step = local_d8.builder.step;
      value_02.builder.structDataSize = local_d8.builder.structDataSize;
      value_02.builder.structPointerCount = local_d8.builder.structPointerCount;
      value_02.builder.elementSize = local_d8.builder.elementSize;
      value_02.builder._39_1_ = local_d8.builder._39_1_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_02);
    }
    else {
      local_180.baseType = local_a0._0_2_;
      local_180.listDepth = local_a0[2];
      local_180.isImplicitParam = (bool)local_a0[3];
      local_180.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a0._4_2_;
      local_180._6_2_ = local_a0._6_2_;
      local_180.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
      uVar5 = bounded<unsigned_int>(f.exception._4_4_);
      _::ListBuilder::getPointerElement(&local_1c0,&this->builder,uVar5);
      WVar2 = ListSchema::whichElementType((ListSchema *)local_a0);
      elementSize = anon_unknown_70::elementSizeFor(WVar2);
      _::PointerBuilder::getList(&local_1a8,&local_1c0,elementSize,(word *)0x0);
      schema.elementType.field_4.schema = local_180.field_4.schema;
      schema.elementType.baseType = local_180.baseType;
      schema.elementType.listDepth = local_180.listDepth;
      schema.elementType.isImplicitParam = local_180.isImplicitParam;
      schema.elementType.field_3 = local_180.field_3;
      schema.elementType._6_2_ = local_180._6_2_;
      builder_00.capTable = local_1a8.capTable;
      builder_00.segment = local_1a8.segment;
      builder_00.ptr = local_1a8.ptr;
      builder_00.elementCount = local_1a8.elementCount;
      builder_00.step = local_1a8.step;
      builder_00.structDataSize = local_1a8.structDataSize;
      builder_00.structPointerCount = local_1a8.structPointerCount;
      builder_00.elementSize = local_1a8.elementSize;
      builder_00._39_1_ = local_1a8._39_1_;
      Builder(&local_170,schema,builder_00);
      value_03.schema.elementType.field_4.schema = local_170.schema.elementType.field_4.schema;
      value_03.schema.elementType.baseType = local_170.schema.elementType.baseType;
      value_03.schema.elementType.listDepth = local_170.schema.elementType.listDepth;
      value_03.schema.elementType.isImplicitParam = local_170.schema.elementType.isImplicitParam;
      value_03.schema.elementType.field_3 = local_170.schema.elementType.field_3;
      value_03.schema.elementType._6_2_ = local_170.schema.elementType._6_2_;
      value_03.builder.segment = local_170.builder.segment;
      value_03.builder.capTable = local_170.builder.capTable;
      value_03.builder.ptr = local_170.builder.ptr;
      value_03.builder.elementCount = local_170.builder.elementCount;
      value_03.builder.step = local_170.builder.step;
      value_03.builder.structDataSize = local_170.builder.structDataSize;
      value_03.builder.structPointerCount = local_170.builder.structPointerCount;
      value_03.builder.elementSize = local_170.builder.elementSize;
      value_03.builder._39_1_ = local_170.builder._39_1_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_03);
    }
    break;
  case ENUM:
    f_1.exception = (Exception *)ListSchema::getEnumElementType(&this->schema);
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    uVar3 = _::ListBuilder::getDataElement<unsigned_short>(&this->builder,uVar5);
    DynamicEnum::DynamicEnum(&local_230,(EnumSchema)f_1.exception,uVar3);
    value_13._10_6_ = 0;
    value_13.schema.super_Schema.raw = local_230.schema.super_Schema.raw;
    value_13.value = local_230.value;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_13);
    break;
  case STRUCT:
    local_1f8.raw = (RawBrandedSchema *)ListSchema::getStructElementType(&this->schema);
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    _::ListBuilder::getStructElement(&local_220,&this->builder,uVar5);
    builder_01.capTable = local_220.capTable;
    builder_01.segment = local_220.segment;
    builder_01.data = local_220.data;
    builder_01.pointers = local_220.pointers;
    builder_01.dataSize = local_220.dataSize;
    builder_01.pointerCount = local_220.pointerCount;
    builder_01._38_2_ = local_220._38_2_;
    DynamicStruct::Builder::Builder(&local_1f0,(StructSchema)local_1f8.raw,builder_01);
    value_01.builder.segment = local_1f0.builder.segment;
    value_01.schema.super_Schema.raw = local_1f0.schema.super_Schema.raw;
    value_01.builder.capTable = local_1f0.builder.capTable;
    value_01.builder.data = local_1f0.builder.data;
    value_01.builder.pointers = local_1f0.builder.pointers;
    value_01.builder.dataSize = local_1f0.builder.dataSize;
    value_01.builder.pointerCount = local_1f0.builder.pointerCount;
    value_01.builder._38_2_ = local_1f0.builder._38_2_;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_01);
    break;
  case INTERFACE:
    local_270.pointer = (WirePointer *)ListSchema::getInterfaceElementType(&this->schema);
    uVar5 = bounded<unsigned_int>(f.exception._4_4_);
    _::ListBuilder::getPointerElement(&local_288,&this->builder,uVar5);
    _::PointerBuilder::getCapability(&local_270);
    DynamicCapability::Client::Client
              (&local_258,(InterfaceSchema)local_270.pointer,(Own<capnp::ClientHook> *)&local_270);
    DynamicValue::Builder::Builder(__return_storage_ptr__,&local_258);
    DynamicCapability::Client::~Client(&local_258);
    kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)&local_270);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x47b,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&local_240);
  default:
    DynamicValue::Builder::Builder(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}